

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

SubtreeArray ts_stack_pop_error(Stack *self,StackVersion version)

{
  uint uVar1;
  undefined4 uVar2;
  StackNode *pSVar3;
  StackNode *pSVar4;
  Subtree *pSVar5;
  undefined4 uVar6;
  StackSlice *pSVar7;
  SubtreeArray SVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  undefined3 uVar12;
  _Bool _Var13;
  StackIterator *pSVar14;
  StackLink *pSVar15;
  bool local_129;
  StackSliceArray pop;
  _Bool found_error;
  uint i;
  StackNode *node;
  StackVersion version_local;
  Stack *self_local;
  undefined4 local_f0;
  uint32_t uStack_ec;
  StackIterator current_iterator;
  StackLink link;
  StackIterator *next_iterator;
  undefined1 auStack_a0 [4];
  uint32_t j;
  SubtreeArray subtrees;
  _Bool should_stop;
  _Bool should_pop;
  StackAction action;
  StackNode *node_1;
  StackIterator *iterator_1;
  uint local_70;
  uint32_t size;
  uint32_t i_1;
  _Bool include_subtrees;
  StackIterator iterator;
  StackHead *head;
  
  if ((self->heads).size <= version) {
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x206,"SubtreeArray ts_stack_pop_error(Stack *, StackVersion)");
  }
  pSVar3 = (self->heads).contents[version].node;
  pop.capacity = 0;
  while( true ) {
    if (pSVar3->link_count <= pop.capacity) goto LAB_00130440;
    if ((pSVar3->links[pop.capacity].subtree.ptr != (SubtreeHeapData *)0x0) &&
       (_Var13 = ts_subtree_is_error(pSVar3->links[pop.capacity].subtree), _Var13)) break;
    pop.capacity = pop.capacity + 1;
  }
  pop.size._3_1_ = 0;
  (self->slices).size = 0;
  (self->iterators).size = 0;
  if ((self->heads).size <= version) {
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x118,
                  "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)");
  }
  iterator._24_8_ = (self->heads).contents + version;
  pSVar3 = ((StackHead *)iterator._24_8_)->node;
  iterator.node = (StackNode *)0x0;
  iterator.subtrees.contents._0_4_ = 0;
  iterator.subtrees.contents._4_4_ = 0;
  iterator.subtrees.size = 0;
  iterator.subtrees.capacity = CONCAT31(iterator.subtrees.capacity._1_3_,1);
  array__reserve((VoidArray *)&iterator,8,1);
  array__grow((VoidArray *)&self->iterators,0x20);
  uVar1 = (self->iterators).size;
  (self->iterators).size = uVar1 + 1;
  pSVar14 = (self->iterators).contents + uVar1;
  pSVar14->node = pSVar3;
  (pSVar14->subtrees).contents = (Subtree *)iterator.node;
  (pSVar14->subtrees).size = iterator.subtrees.contents._0_4_;
  (pSVar14->subtrees).capacity = iterator.subtrees.contents._4_4_;
  pSVar14->subtree_count = iterator.subtrees.size;
  pSVar14->is_pending = (_Bool)(char)iterator.subtrees.capacity;
  *(int3 *)&pSVar14->field_0x1d = (int3)(iterator.subtrees.capacity >> 8);
  while ((self->iterators).size != 0) {
    local_70 = 0;
    iterator_1._4_4_ = (self->iterators).size;
    for (; local_70 < iterator_1._4_4_; local_70 = local_70 + 1) {
      pSVar14 = (self->iterators).contents + local_70;
      pSVar3 = pSVar14->node;
      subtrees.capacity = pop_error_callback((void *)((long)&pop.size + 3),pSVar14);
      subtrees.size._3_1_ = (subtrees.capacity & 2) != 0;
      local_129 = true;
      if ((subtrees.capacity & 1) == 0) {
        local_129 = pSVar3->link_count == 0;
      }
      subtrees.size._2_1_ = local_129;
      if ((bool)subtrees.size._3_1_) {
        _auStack_a0 = (pSVar14->subtrees).contents;
        subtrees.contents = *(Subtree **)&(pSVar14->subtrees).size;
        if (local_129 == false) {
          ts_subtree_array_copy(pSVar14->subtrees,(SubtreeArray *)auStack_a0);
        }
        ts_subtree_array_reverse((SubtreeArray *)auStack_a0);
        ts_stack__add_slice(self,version,pSVar3,(SubtreeArray *)auStack_a0);
      }
      if ((subtrees.size._2_1_ & 1) == 0) {
        for (next_iterator._4_4_ = 1; next_iterator._4_4_ <= pSVar3->link_count;
            next_iterator._4_4_ = next_iterator._4_4_ + 1) {
          if (next_iterator._4_4_ == pSVar3->link_count) {
            current_iterator._24_8_ = pSVar3->links[0].node;
            link.node = (StackNode *)pSVar3->links[0].subtree.ptr;
            link.subtree = *(Subtree *)&pSVar3->links[0].is_pending;
            link._16_8_ = (self->iterators).contents + local_70;
LAB_001302ab:
            *(undefined8 *)link._16_8_ = current_iterator._24_8_;
            if (link.node == (StackNode *)0x0) {
              *(int *)(link._16_8_ + 0x18) = *(int *)(link._16_8_ + 0x18) + 1;
              *(undefined1 *)(link._16_8_ + 0x1c) = 0;
            }
            else {
              array__grow((VoidArray *)(link._16_8_ + 8),8);
              uVar1 = *(uint *)(link._16_8_ + 0x10);
              *(uint *)(link._16_8_ + 0x10) = uVar1 + 1;
              *(StackNode **)(*(long *)(link._16_8_ + 8) + (ulong)uVar1 * 8) = link.node;
              ts_subtree_retain((Subtree)link.node);
              _Var13 = ts_subtree_extra((Subtree)link.node);
              if ((!_Var13) &&
                 (*(int *)(link._16_8_ + 0x18) = *(int *)(link._16_8_ + 0x18) + 1,
                 ((ulong)link.subtree.ptr & 1) == 0)) {
                *(undefined1 *)(link._16_8_ + 0x1c) = 0;
              }
            }
          }
          else if ((self->iterators).size < 0x40) {
            pSVar15 = pSVar3->links + next_iterator._4_4_;
            current_iterator._24_8_ = pSVar15->node;
            link.node = (StackNode *)(pSVar15->subtree).ptr;
            link.subtree = *(Subtree *)&pSVar15->is_pending;
            pSVar14 = (self->iterators).contents + local_70;
            pSVar4 = pSVar14->node;
            pSVar5 = (pSVar14->subtrees).contents;
            uVar9 = (pSVar14->subtrees).size;
            uVar10 = (pSVar14->subtrees).capacity;
            uVar11 = pSVar14->subtree_count;
            _Var13 = pSVar14->is_pending;
            uVar12 = *(undefined3 *)&pSVar14->field_0x1d;
            array__grow((VoidArray *)&self->iterators,0x20);
            uVar1 = (self->iterators).size;
            (self->iterators).size = uVar1 + 1;
            pSVar14 = (self->iterators).contents + uVar1;
            pSVar14->node = pSVar4;
            (pSVar14->subtrees).contents = pSVar5;
            (pSVar14->subtrees).size = uVar9;
            (pSVar14->subtrees).capacity = uVar10;
            pSVar14->subtree_count = uVar11;
            pSVar14->is_pending = _Var13;
            *(undefined3 *)&pSVar14->field_0x1d = uVar12;
            if ((self->iterators).size <= (self->iterators).size - 1) {
              __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                            ,0x151,
                            "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                           );
            }
            link._16_8_ = (self->iterators).contents + ((self->iterators).size - 1);
            ts_subtree_array_copy
                      (((StackIterator *)link._16_8_)->subtrees,
                       &((StackIterator *)link._16_8_)->subtrees);
            goto LAB_001302ab;
          }
        }
      }
      else {
        if ((subtrees.size._3_1_ & 1) == 0) {
          ts_subtree_array_delete(self->subtree_pool,&pSVar14->subtrees);
        }
        array__erase((VoidArray *)&self->iterators,0x20,local_70);
        local_70 = local_70 - 1;
        iterator_1._4_4_ = iterator_1._4_4_ - 1;
      }
    }
  }
  pSVar7 = (self->slices).contents;
  pop.contents = *(StackSlice **)&(self->slices).size;
  if ((int)pop.contents == 0) {
LAB_00130440:
    self_local = (Stack *)0x0;
    local_f0 = 0;
    uStack_ec = 0;
  }
  else {
    if ((int)pop.contents != 1) {
      __assert_fail("pop.size == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                    ,0x20c,"SubtreeArray ts_stack_pop_error(Stack *, StackVersion)");
    }
    ts_stack_renumber_version(self,pSVar7->version,version);
    self_local = (Stack *)(pSVar7->subtrees).contents;
    uVar2 = (pSVar7->subtrees).size;
    uVar6 = (pSVar7->subtrees).capacity;
    local_f0 = uVar2;
    uStack_ec = uVar6;
  }
  SVar8.size = local_f0;
  SVar8.contents = (Subtree *)self_local;
  SVar8.capacity = uStack_ec;
  return SVar8;
}

Assistant:

SubtreeArray ts_stack_pop_error(Stack *self, StackVersion version) {
  StackNode *node = array_get(&self->heads, version)->node;
  for (unsigned i = 0; i < node->link_count; i++) {
    if (node->links[i].subtree.ptr && ts_subtree_is_error(node->links[i].subtree)) {
      bool found_error = false;
      StackSliceArray pop = stack__iter(self, version, pop_error_callback, &found_error, 1);
      if (pop.size > 0) {
        assert(pop.size == 1);
        ts_stack_renumber_version(self, pop.contents[0].version, version);
        return pop.contents[0].subtrees;
      }
      break;
    }
  }
  return (SubtreeArray){.size = 0};
}